

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  VarData *pVVar5;
  uint *puVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  Size nelems;
  long lVar14;
  vec<Minisat::Solver::Watcher,_int> *pvVar15;
  Size nelems_00;
  long lVar16;
  bool bVar17;
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::cleanAll(&this->watches);
  if (0 < this->next_var) {
    lVar9 = 0;
    do {
      lVar14 = 0;
      do {
        lVar8 = lVar9 * 2 + lVar14;
        if ((this->watches).occs.map.sz <= lVar8) {
          pcVar10 = 
          "V &Minisat::IntMap<Minisat::Lit, Minisat::vec<Minisat::Solver::Watcher>, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = Minisat::vec<Minisat::Solver::Watcher>, MkIndex = Minisat::MkIndexLit]"
          ;
          goto LAB_0010d4ff;
        }
        pvVar15 = (this->watches).occs.map.data;
        if (0 < pvVar15[lVar8].sz) {
          pvVar15 = pvVar15 + lVar8;
          lVar16 = 0;
          lVar8 = 0;
          do {
            ClauseAllocator::reloc(&this->ca,(CRef *)((long)&pvVar15->data->cref + lVar16),to);
            lVar8 = lVar8 + 1;
            lVar16 = lVar16 + 8;
          } while (lVar8 < pvVar15->sz);
        }
        bVar17 = lVar14 == 0;
        lVar14 = lVar14 + 1;
      } while (bVar17);
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->next_var);
  }
  if (0 < (this->trail).sz) {
    lVar9 = 0;
    do {
      iVar7 = (this->trail).data[lVar9].x >> 1;
      iVar12 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz;
      if (iVar12 <= iVar7) {
LAB_0010d528:
        pcVar10 = 
        "const V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) const [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
LAB_0010d5ac:
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x27,pcVar10);
      }
      pVVar5 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
      uVar2 = pVVar5[iVar7].reason;
      uVar11 = (ulong)uVar2;
      if (uVar11 != 0xffffffff) {
        if ((this->ca).ra.sz <= uVar2) {
          __assert_fail("r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                        ,0x3f,
                        "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        puVar6 = (this->ca).ra.memory;
        uVar3 = puVar6[uVar11];
        if ((uVar3 & 0x10) == 0) {
          uVar4 = puVar6[uVar11 + 1];
          iVar13 = (int)uVar4 >> 1;
          if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              sz <= iVar13) {
            pcVar10 = 
            "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
            ;
            goto LAB_0010d5ac;
          }
          bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
                  map.data[iVar13].value;
          if (((byte)uVar4 & 1 ^ bVar1) == l_True && (l_True & 2) == 0 || (bVar1 & l_True & 2) != 0)
          {
            if (iVar12 <= iVar13) goto LAB_0010d528;
            uVar4 = pVVar5[iVar13].reason;
            if (uVar4 != 0xffffffff) {
              if ((this->ca).ra.sz <= uVar4) {
                __assert_fail("r < sz",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                              ,0x43,
                              "const T *Minisat::RegionAllocator<unsigned int>::lea(Ref) const [T = unsigned int]"
                             );
              }
              if (uVar4 == uVar2) goto LAB_0010d362;
            }
          }
        }
        else {
LAB_0010d362:
          if ((this->ca).ra.sz <= uVar2) goto LAB_0010d509;
          if ((uVar3 & 3) == 1) {
            __assert_fail("!isRemoved(reason(v))",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                          ,0x405,"void Minisat::Solver::relocAll(ClauseAllocator &)");
          }
          if ((this->vardata).
              super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz <=
              iVar7) {
            pcVar10 = 
            "V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
            ;
LAB_0010d4ff:
            __assert_fail("has(k)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                          ,0x28,pcVar10);
          }
          ClauseAllocator::reloc(&this->ca,&pVVar5[iVar7].reason,to);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->trail).sz);
  }
  nelems_00 = 0;
  nelems = 0;
  if (0 < (this->learnts).sz) {
    lVar9 = 0;
    lVar14 = 0;
    iVar12 = 0;
    do {
      puVar6 = (this->learnts).data;
      uVar2 = *(uint *)((long)puVar6 + lVar9);
      if ((this->ca).ra.sz <= uVar2) goto LAB_0010d509;
      if (((this->ca).ra.memory[uVar2] & 3) != 1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar6 + lVar9),to);
        puVar6 = (this->learnts).data;
        lVar8 = (long)iVar12;
        iVar12 = iVar12 + 1;
        puVar6[lVar8] = *(uint *)((long)puVar6 + lVar9);
      }
      lVar14 = lVar14 + 1;
      lVar9 = lVar9 + 4;
    } while (lVar14 < (this->learnts).sz);
    nelems = (int)lVar14 - iVar12;
  }
  vec<unsigned_int,_int>::shrink(&this->learnts,nelems);
  if (0 < (this->clauses).sz) {
    lVar9 = 0;
    lVar14 = 0;
    iVar12 = 0;
    do {
      puVar6 = (this->clauses).data;
      uVar2 = *(uint *)((long)puVar6 + lVar9);
      if ((this->ca).ra.sz <= uVar2) {
LAB_0010d509:
        __assert_fail("r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                      ,0x40,
                      "const T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) const [T = unsigned int]"
                     );
      }
      if (((this->ca).ra.memory[uVar2] & 3) != 1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar6 + lVar9),to);
        puVar6 = (this->clauses).data;
        lVar8 = (long)iVar12;
        iVar12 = iVar12 + 1;
        puVar6[lVar8] = *(uint *)((long)puVar6 + lVar9);
      }
      lVar14 = lVar14 + 1;
      lVar9 = lVar9 + 4;
    } while (lVar14 < (this->clauses).sz);
    nelems_00 = (int)lVar14 - iVar12;
  }
  vec<unsigned_int,_int>::shrink(&this->clauses,nelems_00);
  return;
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    // All watchers:
    //
    watches.cleanAll();
    for (int v = 0; v < nVars(); v++)
        for (int s = 0; s < 2; s++){
            Lit p = mkLit(v, s);
            vec<Watcher>& ws = watches[p];
            for (int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
        }

    // All reasons:
    //
    for (int i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        // Note: it is not safe to call 'locked()' on a relocated clause. This is why we keep
        // 'dangling' reasons here. It is safe and does not hurt.
        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)]))){
            assert(!isRemoved(reason(v)));
            ca.reloc(vardata[v].reason, to);
        }
    }

    // All learnt:
    //
    int i, j;
    for (i = j = 0; i < learnts.size(); i++)
        if (!isRemoved(learnts[i])){
            ca.reloc(learnts[i], to);
            learnts[j++] = learnts[i];
        }
    learnts.shrink(i - j);

    // All original:
    //
    for (i = j = 0; i < clauses.size(); i++)
        if (!isRemoved(clauses[i])){
            ca.reloc(clauses[i], to);
            clauses[j++] = clauses[i];
        }
    clauses.shrink(i - j);
}